

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O3

void __thiscall
de::details::
UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
::reset(UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
        *this)

{
  Memory *pMVar1;
  VkDeviceMemory obj;
  
  pMVar1 = (this->m_data).ptr;
  if (pMVar1 != (Memory *)0x0) {
    obj.m_internal =
         (pMVar1->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                (&(pMVar1->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                 obj);
    }
    operator_delete(pMVar1,0x48);
    (this->m_data).ptr = (Memory *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}